

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sstring_view_archive.hpp
# Opt level: O1

void pstore::serialize::serializer<pstore::sstring_view<std::shared_ptr<char_const>>,void>::
     readsv<pstore::serialize::archive::database_reader&>(database_reader *archive,value_type *str)

{
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  _Var1;
  size_t distance;
  _func_int **local_30;
  __uniq_ptr_impl<std::array<pstore::sat_entry,_65536UL>,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  local_28;
  
  distance = string_helper::read_length<pstore::serialize::archive::database_reader&>(archive);
  database::getro<char,void>
            ((database *)&stack0xffffffffffffffd0,(typed_address<char>)archive->db_,
             (archive->addr_).a_);
  _Var1._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       local_28._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  (str->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_30;
  (str->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28._M_t.
  super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
  .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl =
       (tuple<std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
        )(_Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
          )0x0;
  (str->ptr_).super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       _Var1._M_t.
       super__Tuple_impl<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_std::default_delete<std::array<pstore::sat_entry,_65536UL>_>_>
       .super__Head_base<0UL,_std::array<pstore::sat_entry,_65536UL>_*,_false>._M_head_impl;
  local_30 = (_func_int **)0x0;
  str->size_ = distance;
  address::operator+=(&archive->addr_,distance);
  return;
}

Assistant:

static void readsv (DBReader && archive, value_type & str) {
                std::size_t const length =
                    string_helper::read_length (std::forward<DBReader> (archive));
                new (&str) value_type (read_string_view (
                    archive.get_db (), typed_address<char> (archive.get_address ()), length));
                archive.skip (length);
            }